

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

void __thiscall
helics::RandomDropFilterOperation::RandomDropFilterOperation(RandomDropFilterOperation *this)

{
  pointer p_Var1;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<helics::MessageConditionalOperator,_std::allocator<helics::MessageConditionalOperator>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_48;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  (this->super_FilterOperations)._vptr_FilterOperations =
       (_func_int **)&PTR__RandomDropFilterOperation_00447b68;
  (this->dropProb).super___atomic_float<double>._M_fp = 0.0;
  (this->tcond).super___shared_ptr<helics::MessageConditionalOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  p_Var1 = std::
           allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<helics::MessageConditionalOperator,_std::allocator<helics::MessageConditionalOperator>,_(__gnu_cxx::_Lock_policy)2>_>_>
           ::allocate(&__a2,1);
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00447e20;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(const_helics::Message_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:290:56)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_helics::Message_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:290:56)>
             ::_M_manager;
  local_48._M_alloc = &__a2;
  local_48._M_ptr = p_Var1;
  local_38._M_unused._M_object = this;
  MessageConditionalOperator::MessageConditionalOperator
            ((MessageConditionalOperator *)&p_Var1->_M_impl,
             (function<bool_(const_helics::Message_*)> *)&local_38);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  local_48._M_ptr = (pointer)0x0;
  (this->tcond).super___shared_ptr<helics::MessageConditionalOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = &p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
  (this->tcond).super___shared_ptr<helics::MessageConditionalOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&p_Var1->_M_impl;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<helics::MessageConditionalOperator,_std::allocator<helics::MessageConditionalOperator>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_48);
  return;
}

Assistant:

RandomDropFilterOperation::RandomDropFilterOperation():
    tcond(std::make_shared<MessageConditionalOperator>([this](const Message* /*unused*/) {
        return (randDouble(RandomDistributions::BERNOULLI, (1.0 - dropProb), 1.0) > 0.1);
    }))
{
}